

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O2

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<2,_9,_9>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int in_ECX;
  MatrixCaseUtils local_b4 [12];
  Type in1;
  Type in0;
  VecAccess<float,_4,_3> local_60;
  Matrix<float,_3,_3> local_44;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    getInputValue<2,9>(&in0,(MatrixCaseUtils *)evalCtx,(ShaderEvalContext *)0x0,in_ECX);
  }
  else {
    tcu::Matrix<float,_3,_3>::Matrix(&in0,(float *)s_constInMat3x3);
  }
  if (in1Type == INPUTTYPE_DYNAMIC) {
    getInputValue<2,9>(&in1,(MatrixCaseUtils *)evalCtx,(ShaderEvalContext *)&DAT_00000001,in_ECX);
  }
  else {
    tcu::Matrix<float,_3,_3>::Matrix(&in1,(float *)(s_constInMat3x3 + 0x24));
  }
  tcu::operator*(&local_44,&in0,&in1);
  reduceToVec3(local_b4,&local_44);
  local_60.m_vector = &evalCtx->color;
  local_60.m_index[0] = 0;
  local_60.m_index[1] = 1;
  local_60.m_index[2] = 2;
  tcu::VecAccess<float,_4,_3>::operator=(&local_60,(Vector<float,_3> *)local_b4);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(in0 * in1);
	}